

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O0

int Wlc_NtkCountConstBits(int *pArray,int nSize)

{
  bool local_1d;
  int local_1c;
  int local_18;
  int Counter;
  int i;
  int nSize_local;
  int *pArray_local;
  
  local_1c = 0;
  for (local_18 = 0; local_18 < nSize; local_18 = local_18 + 1) {
    local_1d = true;
    if (pArray[local_18] != 0) {
      local_1d = pArray[local_18] == 1;
    }
    local_1c = (uint)local_1d + local_1c;
  }
  return local_1c;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Counts constant bits.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Wlc_NtkCountConstBits( int * pArray, int nSize )
{
    int i, Counter = 0;
    for ( i = 0; i < nSize; i++ )
        Counter += (pArray[i] == 0 || pArray[i] == 1);
    return Counter;
}